

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

int __thiscall QtMWidgets::PickerPrivate::init(PickerPrivate *this,EVP_PKEY_CTX *ctx)

{
  Picker *pPVar1;
  int iVar2;
  QStandardItemModel *this_00;
  Scroller *this_01;
  QColor *pQVar3;
  QStyleOption local_68 [8];
  QStyleOption opt;
  QPalette local_40 [44];
  QSizePolicy local_14;
  PickerPrivate *local_10;
  PickerPrivate *this_local;
  
  pPVar1 = this->q;
  local_10 = this;
  QSizePolicy::QSizePolicy(&local_14,Preferred,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)pPVar1);
  pPVar1 = this->q;
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,0,1,(QObject *)this->q);
  Picker::setModel(pPVar1,(QAbstractItemModel *)this_00);
  this_01 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_01,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_01;
  QStyleOption::QStyleOption(local_68,1,0);
  QStyleOption::initFrom((QWidget *)local_68);
  pQVar3 = QPalette::color(local_40,Highlight);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar3;
  *(undefined4 *)((long)&(this->highlightColor).ct + 4) = *(undefined4 *)((long)&pQVar3->ct + 4);
  (this->highlightColor).ct.argb.pad = (pQVar3->ct).argb.pad;
  iVar2 = QStyleOption::~QStyleOption(local_68);
  return iVar2;
}

Assistant:

void
PickerPrivate::init()
{
	q->setSizePolicy( QSizePolicy( QSizePolicy::Preferred,
		QSizePolicy::Fixed ) );

	q->setModel( new QStandardItemModel( 0, 1, q ) );

	scroller = new Scroller( q, q );

	QStyleOption opt;
	opt.initFrom( q );

	highlightColor = opt.palette.color( QPalette::Highlight );
}